

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib591.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  FILE *__stream;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  timeval tVar10;
  undefined8 uStack_1e0;
  int maxfd;
  int running;
  long timeout;
  timeval local_1c0;
  int msgs_left;
  fd_set fdwrite;
  fd_set fdexcep;
  
  tv_test_start = tutil_tvnow();
  __stream = fopen64(libtest_arg3,"rb");
  uVar8 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    pcVar7 = strerror(iVar1);
    curl_mfprintf(uVar8,"fopen() failed with error: %d (%s)\n",iVar1,pcVar7);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg3);
    iVar1 = 0x75;
    goto LAB_00102594;
  }
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      lVar9 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                    ,0x3e);
      iVar1 = 0x7c;
      goto LAB_00102577;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uStack_1e0 = 0x44;
        goto LAB_00102566;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2e,1);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uStack_1e0 = 0x47;
        goto LAB_00102566;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2719,__stream);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uStack_1e0 = 0x4a;
        goto LAB_00102566;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2721,"-");
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uStack_1e0 = 0x4d;
        goto LAB_00102566;
      }
      lVar9 = strtol(libtest_arg2,(char **)0x0,10);
      iVar1 = curl_easy_setopt(lVar3,0xd4,lVar9 * 1000);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uStack_1e0 = 0x51;
        goto LAB_00102566;
      }
      lVar9 = curl_multi_init();
      if (lVar9 == 0) {
        lVar9 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                      ,0x53);
        iVar1 = 0x7b;
      }
      else {
        iVar1 = curl_multi_add_handle(lVar9,lVar3);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_1e0 = 0x55;
          goto LAB_00102566;
        }
        do {
          timeout = -99;
          maxfd = -99;
          iVar1 = curl_multi_perform(lVar9,&running);
          uVar8 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uStack_1e0 = 0x5f;
            goto LAB_00102566;
          }
          if (running < 0) {
            pcVar7 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uStack_1e0 = 0x5f;
LAB_00102893:
            curl_mfprintf(_stderr,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,uStack_1e0);
            iVar1 = 0x7a;
            goto LAB_00102577;
          }
          tVar10 = tutil_tvnow();
          lVar4 = tutil_tvdiff(tVar10,tv_test_start);
          if (60000 < lVar4) {
            uStack_1e0 = 0x61;
            goto LAB_00102824;
          }
          if (running == 0) {
            lVar4 = curl_multi_info_read(lVar9,&msgs_left);
            if (lVar4 == 0) {
              iVar1 = 0;
            }
            else {
              iVar1 = *(int *)(lVar4 + 0x10);
            }
            goto LAB_00102577;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            (&msgs_left + lVar4 * 2)[0] = 0;
            (&msgs_left + lVar4 * 2)[1] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            fdwrite.__fds_bits[lVar4] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            fdexcep.__fds_bits[lVar4] = 0;
          }
          iVar1 = curl_multi_fdset(lVar9,&msgs_left,&fdwrite,&fdexcep,&maxfd);
          uVar8 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
            uStack_1e0 = 0x6a;
            goto LAB_00102566;
          }
          if (maxfd < -1) {
            pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
            uStack_1e0 = 0x6a;
            goto LAB_00102893;
          }
          iVar1 = curl_multi_timeout(lVar9,&timeout);
          uVar8 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
            uStack_1e0 = 0x6e;
            goto LAB_00102566;
          }
          if (timeout < -1) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,0x6e,timeout);
            iVar1 = 0x73;
            goto LAB_00102577;
          }
          if (timeout == -1) {
            local_1c0.tv_sec = 0;
            local_1c0.tv_usec = 100000;
          }
          else {
            uVar5 = timeout;
            if (0x7ffffffe < (ulong)timeout) {
              uVar5 = 0x7fffffff;
            }
            local_1c0.tv_sec = (uVar5 & 0xffffffff) / 1000;
            local_1c0.tv_usec = (__suseconds_t)(uint)((int)((uVar5 & 0xffffffff) % 1000) * 1000);
          }
          iVar1 = select_wrapper(maxfd + 1,(fd_set *)&msgs_left,&fdwrite,&fdexcep,&local_1c0);
          if (iVar1 == -1) {
            piVar6 = __errno_location();
            uVar8 = _stderr;
            iVar1 = *piVar6;
            pcVar7 = strerror(iVar1);
            curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,0x7c,iVar1,pcVar7);
            iVar1 = 0x79;
            goto LAB_00102577;
          }
          tVar10 = tutil_tvnow();
          lVar4 = tutil_tvdiff(tVar10,tv_test_start);
        } while (lVar4 < 0xea61);
        uStack_1e0 = 0x7e;
LAB_00102824:
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                      ,uStack_1e0);
        iVar1 = 0x7d;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uStack_1e0 = 0x41;
LAB_00102566:
      curl_mfprintf(uVar8,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                    ,uStack_1e0,iVar1,uVar2);
    }
LAB_00102577:
    curl_multi_cleanup(lVar9);
    curl_easy_cleanup(lVar3);
    curl_global_cleanup();
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                  ,0x38,iVar1,uVar2);
  }
  fclose(__stream);
LAB_00102594:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  CURLMsg *msg;
  FILE *upload = NULL;

  start_test_timing();

  upload = fopen(libtest_arg3, "rb");
  if(!upload) {
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg3);
    return TEST_ERR_FOPEN;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(upload);
    return res;
  }

  easy_init(easy);

  /* go verbose */
  easy_setopt(easy, CURLOPT_VERBOSE, 1L);

  /* specify target */
  easy_setopt(easy, CURLOPT_URL, URL);

  /* enable uploading */
  easy_setopt(easy, CURLOPT_UPLOAD, 1L);

  /* data pointer for the file read function */
  easy_setopt(easy, CURLOPT_READDATA, upload);

  /* use active mode FTP */
  easy_setopt(easy, CURLOPT_FTPPORT, "-");

  /* server connection timeout */
  easy_setopt(easy, CURLOPT_ACCEPTTIMEOUT_MS,
              strtol(libtest_arg2, NULL, 10)*1000);

  multi_init(multi);

  multi_add_handle(multi, easy);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 100000L; /* 100 ms */
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &msgs_left);
  if(msg)
    res = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  /* close the local file */
  fclose(upload);

  return res;
}